

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult __thiscall
VmaAllocator_T::BindVulkanBuffer
          (VmaAllocator_T *this,VkDeviceMemory memory,VkDeviceSize memoryOffset,VkBuffer buffer,
          void *pNext)

{
  PFN_vkBindBufferMemory2KHR p_Var1;
  VkResult VVar2;
  VkBindBufferMemoryInfo local_28;
  
  if (pNext == (void *)0x0) {
    VVar2 = (*(this->m_VulkanFunctions).vkBindBufferMemory)
                      (this->m_hDevice,buffer,memory,memoryOffset);
    return VVar2;
  }
  if (((this->m_UseKhrBindMemory2 != false) || (0x400fff < this->m_VulkanApiVersion)) &&
     (p_Var1 = (this->m_VulkanFunctions).vkBindBufferMemory2KHR,
     p_Var1 != (PFN_vkBindBufferMemory2KHR)0x0)) {
    local_28.sType = VK_STRUCTURE_TYPE_BIND_BUFFER_MEMORY_INFO;
    local_28._4_4_ = 0;
    local_28.pNext = pNext;
    local_28.buffer = buffer;
    local_28.memory = memory;
    local_28.memoryOffset = memoryOffset;
    VVar2 = (*p_Var1)(this->m_hDevice,1,&local_28);
    return VVar2;
  }
  return VK_ERROR_EXTENSION_NOT_PRESENT;
}

Assistant:

VkResult VmaAllocator_T::BindVulkanBuffer(
    VkDeviceMemory memory,
    VkDeviceSize memoryOffset,
    VkBuffer buffer,
    const void* pNext)
{
    if(pNext != VMA_NULL)
    {
#if VMA_VULKAN_VERSION >= 1001000 || VMA_BIND_MEMORY2
        if((m_UseKhrBindMemory2 || m_VulkanApiVersion >= VK_MAKE_VERSION(1, 1, 0)) &&
            m_VulkanFunctions.vkBindBufferMemory2KHR != VMA_NULL)
        {
            VkBindBufferMemoryInfoKHR bindBufferMemoryInfo = { VK_STRUCTURE_TYPE_BIND_BUFFER_MEMORY_INFO_KHR };
            bindBufferMemoryInfo.pNext = pNext;
            bindBufferMemoryInfo.buffer = buffer;
            bindBufferMemoryInfo.memory = memory;
            bindBufferMemoryInfo.memoryOffset = memoryOffset;
            return (*m_VulkanFunctions.vkBindBufferMemory2KHR)(m_hDevice, 1, &bindBufferMemoryInfo);
        }
        else
#endif // #if VMA_VULKAN_VERSION >= 1001000 || VMA_BIND_MEMORY2
        {
            return VK_ERROR_EXTENSION_NOT_PRESENT;
        }
    }
    else
    {
        return (*m_VulkanFunctions.vkBindBufferMemory)(m_hDevice, buffer, memory, memoryOffset);
    }
}